

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

void erased_node(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  vmd_bst_node_t *node_local;
  vmd_bst_t *tree_local;
  
  if (tree->tip == (vmd_bst_rev_t *)0x0) {
    free(node);
  }
  else if (((byte)node->field_0x20 >> 5 & 1) == 0) {
    slist_push(&tree->erased,node);
  }
  else {
    dlist_insert(&tree->free,node);
  }
  return;
}

Assistant:

static void
erased_node(bst_t *tree, bst_node_t *node)
{
	if (tree->tip == NULL)
		free(node);
	else if (node->inserted)
		dlist_insert(&tree->free, node);
	else
		slist_push(&tree->erased, node);
}